

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef BinaryenDrop(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  Drop *pDVar1;
  Builder local_28 [2];
  Drop *ret;
  BinaryenExpressionRef value_local;
  BinaryenModuleRef module_local;
  
  ret = (Drop *)value;
  value_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(local_28,module);
  pDVar1 = wasm::Builder::makeDrop(local_28,(Expression *)ret);
  return (BinaryenExpressionRef)pDVar1;
}

Assistant:

BinaryenExpressionRef BinaryenDrop(BinaryenModuleRef module,
                                   BinaryenExpressionRef value) {
  auto* ret = Builder(*(Module*)module).makeDrop((Expression*)value);
  return static_cast<Expression*>(ret);
}